

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O0

void __thiscall tst_helpers_connect::rejectOneSenderManyArgs(tst_helpers_connect *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  bool local_82;
  bool local_81;
  int local_80;
  bool local_7a;
  bool local_79 [7];
  bool local_72;
  bool local_71;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  PromiseFromSignal<void_(Object::*)()> p;
  type local_30;
  undefined1 local_28 [8];
  Object sender;
  tst_helpers_connect *this_local;
  
  sender._16_8_ = this;
  Object::Object((Object *)local_28);
  local_30.sender = (Object *)local_28;
  QtPromisePrivate::qtpromise_defer<tst_helpers_connect::rejectOneSenderManyArgs()::__0>(&local_30);
  local_60 = Object::noArgSignal;
  local_58 = 0;
  local_70 = Object::twoArgsSignal;
  local_68 = 0;
  QtPromise::connect<Object,void(Object::*)(),void(Object::*)(int,QString_const&)>
            ((QtPromise *)local_50,(Object *)local_28,0x134690,0);
  local_71 = Object::hasConnections((Object *)local_28);
  local_72 = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_71,&local_72,"sender.hasConnections()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x7c);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_79[0] = QtPromise::QPromiseBase<void>::isPending((QPromiseBase<void> *)local_50);
    local_7a = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_79,&local_7a,"p.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x7d);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_80 = -1;
      iVar3 = waitForError<int>((QPromise<void> *)local_50,&local_80);
      bVar2 = QTest::qCompare(iVar3,0x2a,"waitForError(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                              ,0x7e);
      if (((bVar2 ^ 0xff) & 1) == 0) {
        local_81 = Object::hasConnections((Object *)local_28);
        local_82 = false;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_81,&local_82,"sender.hasConnections()","false",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                           ,0x7f);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          local_79[1] = false;
          local_79[2] = false;
          local_79[3] = false;
          local_79[4] = false;
        }
        else {
          local_79[1] = true;
          local_79[2] = false;
          local_79[3] = false;
          local_79[4] = false;
        }
      }
      else {
        local_79[1] = true;
        local_79[2] = false;
        local_79[3] = false;
        local_79[4] = false;
      }
    }
    else {
      local_79[1] = true;
      local_79[2] = false;
      local_79[3] = false;
      local_79[4] = false;
    }
  }
  else {
    local_79[1] = true;
    local_79[2] = false;
    local_79[3] = false;
    local_79[4] = false;
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_50);
  Object::~Object((Object *)local_28);
  return;
}

Assistant:

void tst_helpers_connect::rejectOneSenderManyArgs()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.twoArgsSignal(42, "bar");
    });

    auto p = QtPromise::connect(&sender, &Object::noArgSignal, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<void>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, -1), 42);
    QCOMPARE(sender.hasConnections(), false);
}